

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O3

Value __thiscall duckdb_tdigest::TDigest::quantile(TDigest *this,Value q)

{
  Value VVar1;
  
  if (((this->unprocessed_).
       super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
       _M_impl.super__Vector_impl_data._M_finish !=
       (this->unprocessed_).
       super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
       _M_impl.super__Vector_impl_data._M_start) ||
     (this->maxProcessed_ <
      (ulong)((long)(this->processed_).
                    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->processed_).
                    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4))) {
    process(this);
  }
  VVar1 = quantileProcessed(this,q);
  return VVar1;
}

Assistant:

Value quantile(Value q) {
		if (haveUnprocessed() || isDirty()) {
			process();
		}
		return quantileProcessed(q);
	}